

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void anon_unknown.dwarf_33ee6::
     SequenceTester<std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
     ::exec(void)

{
  initializer_list<int> args;
  initializer_list<QtPromise::QPromise<int>_> __l;
  bool bVar1;
  __normal_iterator<QtPromise::QPromise<int>_*,_std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  *__i;
  QPromise<int> *local_160;
  int local_150 [4];
  iterator local_140;
  undefined8 local_138;
  QList<int> local_130;
  QList<int> local_118;
  QList<int> local_100;
  undefined4 local_e8;
  bool local_e2;
  bool local_e1;
  undefined1 local_e0 [8];
  QPromise<QList<int>_> p;
  int local_c4;
  value_type local_c0;
  __normal_iterator<QtPromise::QPromise<int>_*,_std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
  local_b0;
  const_iterator local_a8;
  int local_9c;
  value_type local_98;
  allocator<QtPromise::QPromise<int>_> local_85;
  int local_84 [6];
  int local_6c;
  QtPromise *local_68;
  QPromise<int> local_60;
  QtPromise local_50 [16];
  QtPromise local_40 [16];
  QPromise<int> local_30;
  undefined1 local_20 [8];
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> promises;
  
  local_68 = (QtPromise *)&local_60;
  local_6c = 0x2a;
  QtPromise::resolve<int>(local_68,&local_6c);
  local_68 = local_50;
  local_84[1] = 0x2b;
  QtPromise::resolve<int>(local_68,local_84 + 1);
  local_68 = local_40;
  local_84[0] = 0x2c;
  QtPromise::resolve<int>(local_68,local_84);
  local_30.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&local_60;
  local_30.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x3;
  std::allocator<QtPromise::QPromise<int>_>::allocator(&local_85);
  __l._M_len = (size_type)local_30.super_QPromiseBase<int>.m_d.d;
  __l._M_array = (iterator)local_30.super_QPromiseBase<int>._vptr_QPromiseBase;
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             local_20,__l,&local_85);
  std::allocator<QtPromise::QPromise<int>_>::~allocator(&local_85);
  local_160 = &local_30;
  do {
    local_160 = local_160 + -1;
    QtPromise::QPromise<int>::~QPromise(local_160);
  } while (local_160 != &local_60);
  local_9c = 0x2d;
  QtPromise::resolve<int>((QtPromise *)&local_98,&local_9c);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::push_back
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             local_20,&local_98);
  QtPromise::QPromise<int>::~QPromise(&local_98);
  local_b0._M_current =
       (QPromise<int> *)
       std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::begin
                 ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
                  local_20);
  __i = __gnu_cxx::
        __normal_iterator<QtPromise::QPromise<int>_*,_std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_>
        ::operator++(&local_b0);
  __gnu_cxx::
  __normal_iterator<QtPromise::QPromise<int>const*,std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>
  ::__normal_iterator<QtPromise::QPromise<int>*>
            ((__normal_iterator<QtPromise::QPromise<int>const*,std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>>
              *)&local_a8,__i);
  local_c4 = 0x2e;
  QtPromise::resolve<int>((QtPromise *)&local_c0,&local_c4);
  p.super_QPromiseBase<QList<int>_>.m_d.d =
       (PromiseData<QList<int>_> *)
       std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::insert
                 ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
                  local_20,local_a8,&local_c0);
  QtPromise::QPromise<int>::~QPromise(&local_c0);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::pop_back
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             local_20);
  QtPromise::
  qPromiseAll<std::vector<QtPromise::QPromise<int>,std::allocator<QtPromise::QPromise<int>>>&>
            ((QtPromise *)local_e0,
             (vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             local_20);
  local_e1 = QtPromise::QPromiseBase<QList<int>_>::isPending((QPromiseBase<QList<int>_> *)local_e0);
  local_e2 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_e1,&local_e2,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x32);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (int *)0x0;
    local_118.d.size = 0;
    QList<int>::QList(&local_118);
    waitForValue<QList<int>>(&local_100,(QPromise<QList<int>_> *)local_e0,&local_118);
    local_150[0] = 0x2a;
    local_150[1] = 0x2e;
    local_150[2] = 0x2b;
    local_150[3] = 0x2c;
    local_140 = local_150;
    local_138 = 4;
    args._M_len = 4;
    args._M_array = local_140;
    QList<int>::QList(&local_130,args);
    bVar1 = QTest::qCompare<int>
                      (&local_100,&local_130,"waitForValue(p, QVector<int>{})",
                       "(QVector<int>{42, 46, 43, 44})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x33);
    QList<int>::~QList(&local_130);
    QList<int>::~QList(&local_100);
    QList<int>::~QList(&local_118);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_e8 = 0;
    }
    else {
      local_e8 = 1;
    }
  }
  else {
    local_e8 = 1;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_e0);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::~vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             local_20);
  return;
}

Assistant:

static void exec()
    {
        Sequence promises{QtPromise::resolve(42), QtPromise::resolve(43), QtPromise::resolve(44)};

        promises.push_back(QtPromise::resolve(45));
        promises.insert(++promises.begin(), QtPromise::resolve(46));
        promises.pop_back();

        auto p = qPromiseAll(promises);

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
        QCOMPARE(p.isPending(), true);
        QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 46, 43, 44}));
    }